

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Size XML_GetCurrentLineNumber(XML_Parser parser)

{
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local = (XML_Parser)0x0;
  }
  else {
    if ((parser->m_eventPtr != (char *)0x0) && (parser->m_positionPtr <= parser->m_eventPtr)) {
      (*parser->m_encoding->updatePosition)
                (parser->m_encoding,parser->m_positionPtr,parser->m_eventPtr,&parser->m_position);
      parser->m_positionPtr = parser->m_eventPtr;
    }
    parser_local = (XML_Parser)((parser->m_position).lineNumber + 1);
  }
  return (XML_Size)parser_local;
}

Assistant:

XML_Size XMLCALL
XML_GetCurrentLineNumber(XML_Parser parser) {
  if (parser == NULL)
    return 0;
  if (parser->m_eventPtr && parser->m_eventPtr >= parser->m_positionPtr) {
    XmlUpdatePosition(parser->m_encoding, parser->m_positionPtr,
                      parser->m_eventPtr, &parser->m_position);
    parser->m_positionPtr = parser->m_eventPtr;
  }
  return parser->m_position.lineNumber + 1;
}